

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSContext * JS_GetFunctionRealm(JSContext *ctx,JSValue func_obj)

{
  ushort uVar1;
  JSValueUnion *pJVar2;
  ulong uVar3;
  JSValueUnion JVar4;
  
  JVar4 = func_obj.u;
  uVar3 = func_obj.tag;
  while ((int)uVar3 == -1) {
    uVar1 = *(ushort *)((long)JVar4.ptr + 6);
    if (uVar1 < 0x29) {
      switch(uVar1) {
      case 0xc:
        return *(JSContext **)((long)JVar4.ptr + 0x30);
      case 0xd:
      case 0x10:
switchD_0013bfbf_caseD_d:
        return *(JSContext **)(*(long *)((long)JVar4.ptr + 0x30) + 0x48);
      case 0xe:
        pJVar2 = *(JSValueUnion **)((long)JVar4.ptr + 0x30);
        break;
      default:
        goto switchD_0013bfbf_caseD_f;
      }
    }
    else {
      if (uVar1 != 0x29) {
        if ((uVar1 != 0x2d) && (uVar1 != 0x31)) {
          return ctx;
        }
        goto switchD_0013bfbf_caseD_d;
      }
      pJVar2 = *(JSValueUnion **)((long)JVar4.ptr + 0x30);
      if (pJVar2 == (JSValueUnion *)0x0) {
        return ctx;
      }
      if (*(char *)((long)pJVar2 + 0x21) != '\0') {
        JS_ThrowTypeError(ctx,"revoked proxy");
        return (JSContext *)0x0;
      }
    }
    JVar4 = (JSValueUnion)pJVar2->ptr;
    uVar3 = (ulong)(uint)pJVar2[1].int32;
  }
switchD_0013bfbf_caseD_f:
  return ctx;
}

Assistant:

static JSContext *JS_GetFunctionRealm(JSContext *ctx, JSValueConst func_obj)
{
    JSObject *p;
    JSContext *realm;
    
    if (JS_VALUE_GET_TAG(func_obj) != JS_TAG_OBJECT)
        return ctx;
    p = JS_VALUE_GET_OBJ(func_obj);
    switch(p->class_id) {
    case JS_CLASS_C_FUNCTION:
        realm = p->u.cfunc.realm;
        break;
    case JS_CLASS_BYTECODE_FUNCTION:
    case JS_CLASS_GENERATOR_FUNCTION:
    case JS_CLASS_ASYNC_FUNCTION:
    case JS_CLASS_ASYNC_GENERATOR_FUNCTION:
        {
            JSFunctionBytecode *b;
            b = p->u.func.function_bytecode;
            realm = b->realm;
        }
        break;
    case JS_CLASS_PROXY:
        {
            JSProxyData *s = p->u.opaque;
            if (!s)
                return ctx;
            if (s->is_revoked) {
                JS_ThrowTypeErrorRevokedProxy(ctx);
                return NULL;
            } else {
                realm = JS_GetFunctionRealm(ctx, s->target);
            }
        }
        break;
    case JS_CLASS_BOUND_FUNCTION:
        {
            JSBoundFunction *bf = p->u.bound_function;
            realm = JS_GetFunctionRealm(ctx, bf->func_obj);
        }
        break;
    default:
        realm = ctx;
        break;
    }
    return realm;
}